

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::reserve
          (exhaustive_solver<baryonyx::itm::minimize_tag,_double> *this,size_t max_variables,
          size_t max_z_constraints)

{
  size_t max_z_constraints_local;
  size_t max_variables_local;
  exhaustive_solver<baryonyx::itm::minimize_tag,_double> *this_local;
  
  if (max_variables == 0) {
    details::fail_fast("Assertion","max_variables > 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"103");
  }
  if (max_z_constraints == 0) {
    details::fail_fast("Assertion","max_z_constraints > 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"104");
  }
  std::
  vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
  ::reserve(&this->items,max_variables);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->flat_constraints,max_variables * max_z_constraints);
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve(&this->walkers,max_variables);
  return;
}

Assistant:

void reserve(std::size_t max_variables, std::size_t max_z_constraints)
    {
        bx_assert(max_variables > 0);
        bx_assert(max_z_constraints > 0);

        items.reserve(max_variables);
        flat_constraints.reserve(max_variables * max_z_constraints);
        walkers.reserve(max_variables);
    }